

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kwsParser.cxx
# Opt level: O2

size_t __thiscall
kws::Parser::FindClosingChar
          (Parser *this,char openChar,char closeChar,size_t pos,bool noComment,string *buffer)

{
  char cVar1;
  pointer ppVar2;
  pointer ppVar3;
  ulong uVar4;
  long lVar5;
  const_iterator itLS;
  pointer ppVar6;
  string stream;
  
  std::__cxx11::string::string((string *)&stream,(string *)buffer);
  if ((buffer->_M_string_length == 0) && (std::__cxx11::string::assign((char *)&stream), noComment))
  {
    std::__cxx11::string::assign((char *)&stream);
  }
  ppVar2 = (this->m_IfElseEndifList).
           super__Vector_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  ppVar3 = (this->m_IfElseEndifList).
           super__Vector_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  lVar5 = 1;
  do {
    pos = pos + 1;
    if (stream._M_string_length <= pos) {
      pos = 0xffffffffffffffff;
      break;
    }
    cVar1 = stream._M_dataplus._M_p[pos];
    ppVar6 = ppVar2;
    if (cVar1 == openChar || cVar1 == closeChar) {
      for (; ppVar6 != ppVar3; ppVar6 = ppVar6 + 1) {
        uVar4 = pos;
        if (noComment) {
          uVar4 = GetPositionWithoutComments(this,pos);
        }
        if ((ppVar6->first < uVar4) && (uVar4 < ppVar6->second)) goto LAB_0011ca15;
      }
      if (cVar1 == openChar) {
        lVar5 = lVar5 + 1;
      }
      else {
        lVar5 = lVar5 - (ulong)(cVar1 == closeChar);
      }
    }
LAB_0011ca15:
  } while (lVar5 != 0);
  std::__cxx11::string::~string((string *)&stream);
  return pos;
}

Assistant:

size_t Parser::FindClosingChar(char openChar, char closeChar,
                               size_t pos,bool noComment,std::string buffer) const
{
  std::string stream = buffer;
  if (buffer.empty()) {
    stream = m_Buffer.c_str();
    if(noComment)
      {
      stream = m_BufferNoComment.c_str();
      }
  }

  size_t open = 1;
  for(size_t i=pos+1;i<stream.length();i++)
    {
    if(stream[i] == openChar || stream[i] == closeChar)
      {
      bool skip = false;
      // We want to check that we are not in the #if/#else/#endif thing
      auto itLS = m_IfElseEndifList.begin();
      while(itLS != m_IfElseEndifList.end())
        {
        size_t j = i;
        if(noComment)
          {
          j = this->GetPositionWithoutComments(i);
          }
        if(j>(*itLS).first && j<(*itLS).second)
          {
          skip = true;
          break;
          }
        itLS++;
        }

      if(!skip)
        {
        if(stream[i] == openChar)
          {
          open++;
          }
        else if(stream[i] == closeChar)
          {
          open--;
          }
        }
      }
    if(open == 0)
      {
      return i;
      }
    }
  return std::string::npos; // closing char not found
}